

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printNEONModImmOperand(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  MCOperand *op;
  uint64_t uVar3;
  SStream *in_RDX;
  uint in_ESI;
  MCInst *in_RDI;
  uint64_t Val;
  uint EltBits;
  uint EncodedImm;
  
  op = MCInst_getOperand(in_RDI,in_ESI);
  MCOperand_getImm(op);
  uVar3 = ARM_AM_decodeNEONModImm(in_ESI,(uint *)in_RDX);
  if (uVar3 < 10) {
    SStream_concat(in_RDX,"#%lu",uVar3);
  }
  else {
    SStream_concat(in_RDX,"#0x%lx",uVar3);
  }
  if (in_RDI->csh->detail != CS_OPT_OFF) {
    puVar1 = in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x41;
    puVar1[0] = '\x02';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    *(int *)(in_RDI->flat_insn->detail->groups +
            (ulong)(in_RDI->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x45) = (int)uVar3;
    pcVar2 = in_RDI->flat_insn->detail;
    (pcVar2->field_6).arm.op_count = (pcVar2->field_6).arm.op_count + '\x01';
  }
  return;
}

Assistant:

static void printNEONModImmOperand(MCInst *MI, unsigned OpNum, SStream *O)
{
	unsigned EncodedImm = (unsigned int)MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	unsigned EltBits;
	uint64_t Val = ARM_AM_decodeNEONModImm(EncodedImm, &EltBits);
	if (Val > HEX_THRESHOLD)
		SStream_concat(O, "#0x%"PRIx64, Val);
	else
		SStream_concat(O, "#%"PRIu64, Val);
	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_IMM;
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].imm = (unsigned int)Val;
		MI->flat_insn->detail->arm.op_count++;
	}
}